

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int Gia_ManHashLookup(Gia_Man_t *p,Gia_Obj_t *p0,Gia_Obj_t *p1)

{
  int iVar1;
  int iLit1;
  
  iVar1 = Gia_ObjToLit(p,p0);
  iLit1 = Gia_ObjToLit(p,p1);
  iVar1 = Gia_ManHashLookupInt(p,iVar1,iLit1);
  return iVar1;
}

Assistant:

int Gia_ManHashLookup( Gia_Man_t * p, Gia_Obj_t * p0, Gia_Obj_t * p1 )
{
    int iLit0 = Gia_ObjToLit( p, p0 );
    int iLit1 = Gia_ObjToLit( p, p1 );
    return Gia_ManHashLookupInt( p, iLit0, iLit1 );
}